

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

void duckdb_je_arena_postfork_parent(tsdn_t *tsdn,arena_t *arena)

{
  arena_t *paVar1;
  arena_t *paVar2;
  uint j;
  ulong uVar3;
  arena_t *paVar4;
  szind_t i;
  ulong uVar5;
  
  for (uVar5 = 0; uVar5 != 0x24; uVar5 = uVar5 + 1) {
    paVar2 = arena;
    paVar4 = arena;
    for (uVar3 = 0; uVar3 < duckdb_je_bin_infos[uVar5].n_shards; uVar3 = uVar3 + 1) {
      paVar1 = paVar2;
      if (uVar5 < duckdb_je_bin_info_nbatched_sizes) {
        paVar1 = paVar4;
      }
      duckdb_je_bin_postfork_parent
                (tsdn,(bin_t *)((long)&paVar1->nthreads[0].repr +
                               (ulong)duckdb_je_arena_bin_offsets[uVar5]),
                 uVar5 < duckdb_je_bin_info_nbatched_sizes);
      paVar4 = (arena_t *)&(paVar4->stats).mutex_prof_data[6].n_owner_switches;
      paVar2 = (arena_t *)&(paVar2->stats).mutex_prof_data[0].max_n_thds;
    }
  }
  duckdb_je_malloc_mutex_postfork_parent(tsdn,&arena->large_mtx);
  duckdb_je_base_postfork_parent(tsdn,arena->base);
  duckdb_je_pa_shard_postfork_parent(tsdn,&arena->pa_shard);
  duckdb_je_malloc_mutex_postfork_parent(tsdn,&arena->tcache_ql_mtx);
  return;
}

Assistant:

void
arena_postfork_parent(tsdn_t *tsdn, arena_t *arena) {
	for (szind_t i = 0; i < SC_NBINS; i++) {
		for (unsigned j = 0; j < bin_infos[i].n_shards; j++) {
			bin_t *bin = arena_get_bin(arena, i, j);
			bin_postfork_parent(tsdn, bin, arena_bin_has_batch(i));
		}
	}

	malloc_mutex_postfork_parent(tsdn, &arena->large_mtx);
	base_postfork_parent(tsdn, arena->base);
	pa_shard_postfork_parent(tsdn, &arena->pa_shard);
	if (config_stats) {
		malloc_mutex_postfork_parent(tsdn, &arena->tcache_ql_mtx);
	}
}